

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
VanSimulationDataGenerator::VanSimulationDataGenerator(VanSimulationDataGenerator *this)

{
  allocator local_11;
  VanSimulationDataGenerator *local_10;
  VanSimulationDataGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->mSerialText,"My first analyzer, woo hoo!",&local_11)
  ;
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->mStringIndex = 0;
  SimulationChannelDescriptor::SimulationChannelDescriptor(&this->mSerialSimulationData);
  return;
}

Assistant:

VanSimulationDataGenerator::VanSimulationDataGenerator()
:	mSerialText( "My first analyzer, woo hoo!" ),
    mStringIndex( 0 )
{
}